

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void do_save_file_proc(Am_Object *cmd)

{
  Am_Object_Method_Type *pAVar1;
  byte bVar2;
  ulong uVar3;
  Am_Value *pAVar4;
  char *filename;
  Am_Object local_30 [3];
  Am_String local_18;
  Am_Object *local_10;
  Am_Object *cmd_local;
  
  local_10 = cmd;
  uVar3 = Am_Object::Valid();
  if ((uVar3 & 1) != 0) {
    Am_Object::Set(0x5630,true,0);
    pAVar4 = (Am_Value *)Am_Object::Get(0x5638,0x169);
    Am_String::operator=(&current_filename,pAVar4);
    pAVar4 = (Am_Value *)Am_Object::Get(0x5640,0x169);
    Am_String::Am_String(&local_18,pAVar4);
    bVar2 = Am_String::operator==(&local_18,(Am_String *)&classifier_and_examples);
    save_with_examples = (bool)(bVar2 & 1);
    Am_String::~Am_String(&local_18);
  }
  uVar3 = Am_String::operator==(&current_filename,"");
  pAVar1 = do_show_save_dialog.Call;
  if ((uVar3 & 1) == 0) {
    filename = Am_String::operator_cast_to_char_(&current_filename);
    Save_Trainer(filename,(bool)(save_with_examples & 1));
    dirty = false;
  }
  else {
    Am_Object::Am_Object(local_30,(Am_Object *)cmd);
    (*pAVar1)((Am_Object_Data *)local_30);
    Am_Object::~Am_Object(local_30);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_save_file, (Am_Object cmd))
{
  if (save_dialog.Valid()) {
    save_dialog.Set(Am_VISIBLE, false);
    current_filename = save_dialog_filename.Get(Am_VALUE);
    save_with_examples = (Am_String(save_dialog_format.Get(Am_VALUE)) ==
                          classifier_and_examples);
  }

  if (current_filename == "") {
    do_show_save_dialog.Call(cmd);
    return;
  }

  Save_Trainer(current_filename, save_with_examples);
  dirty = false;
}